

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O1

void __thiscall
tchecker::system::loc_t::loc_t
          (loc_t *this,process_id_t pid,loc_id_t id,string *name,attributes_t *attributes)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  invalid_argument *this_00;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>_>_>
  local_30;
  
  this->_pid = pid;
  this->_id = id;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  local_30._M_h = (__hashtable_alloc *)&this->_attributes;
  (this->_attributes)._map._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_attributes)._map._M_h._M_bucket_count = (attributes->_map)._M_h._M_bucket_count;
  (this->_attributes)._map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_attributes)._map._M_h._M_element_count = (attributes->_map)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(attributes->_map)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (attributes->_map)._M_h._M_rehash_policy._M_next_resize;
  (this->_attributes)._map._M_h._M_rehash_policy._M_max_load_factor =
       (attributes->_map)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->_attributes)._map._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->_attributes)._map._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->_attributes)._map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)local_30._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)attributes,&local_30);
  if ((this->_name)._M_string_length != 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"empty name");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

loc_t::loc_t(tchecker::process_id_t pid, tchecker::loc_id_t id, std::string const & name,
             tchecker::system::attributes_t const & attributes)
    : _pid(pid), _id(id), _name(name), _attributes(attributes)
{
  if (_name.empty())
    throw std::invalid_argument("empty name");
}